

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_eval_ble(TCGContext_conflict8 *tcg_ctx,TCGv_i32 dst,TCGv_i32 src)

{
  TCGv_i32 reg;
  TCGv_i32 t0;
  TCGv_i32 src_local;
  TCGv_i32 dst_local;
  TCGContext_conflict8 *tcg_ctx_local;
  
  reg = tcg_temp_new_i64(tcg_ctx);
  gen_mov_reg_N(tcg_ctx,reg,src);
  gen_mov_reg_V(tcg_ctx,dst,src);
  tcg_gen_xor_i64_sparc64(tcg_ctx,dst,dst,reg);
  gen_mov_reg_Z(tcg_ctx,reg,src);
  tcg_gen_or_i64_sparc64(tcg_ctx,dst,dst,reg);
  tcg_temp_free_i64(tcg_ctx,reg);
  return;
}

Assistant:

static inline void gen_op_eval_ble(TCGContext *tcg_ctx, TCGv dst, TCGv_i32 src)
{
    TCGv t0 = tcg_temp_new(tcg_ctx);
    gen_mov_reg_N(tcg_ctx, t0, src);
    gen_mov_reg_V(tcg_ctx, dst, src);
    tcg_gen_xor_tl(tcg_ctx, dst, dst, t0);
    gen_mov_reg_Z(tcg_ctx, t0, src);
    tcg_gen_or_tl(tcg_ctx, dst, dst, t0);
    tcg_temp_free(tcg_ctx, t0);
}